

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mailbox.cpp
# Opt level: O3

void __thiscall zmq::mailbox_t::~mailbox_t(mailbox_t *this)

{
  mutex_t *__mutex;
  atomic_ptr_t<zmq::yqueue_t<zmq::command_t,_16>::chunk_t> *paVar1;
  __pointer_type __ptr;
  chunk_t *__ptr_00;
  int iVar2;
  char *pcVar3;
  
  __mutex = &this->_sync;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 != 0) {
    pcVar3 = strerror(iVar2);
    fprintf(_stderr,"%s (%s:%d)\n",pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/mutex.hpp"
            ,0x88);
    fflush(_stderr);
    zmq_abort(pcVar3);
  }
  iVar2 = pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  if (iVar2 != 0) {
    pcVar3 = strerror(iVar2);
    fprintf(_stderr,"%s (%s:%d)\n",pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/mutex.hpp"
            ,0x98);
    fflush(_stderr);
    zmq_abort(pcVar3);
  }
  mutex_t::~mutex_t(__mutex);
  signaler_t::~signaler_t(&this->_signaler);
  while (__ptr_00 = (this->_cpipe)._queue._begin_chunk, __ptr_00 != (this->_cpipe)._queue._end_chunk
        ) {
    (this->_cpipe)._queue._begin_chunk = __ptr_00->next;
    free(__ptr_00);
  }
  free(__ptr_00);
  LOCK();
  paVar1 = &(this->_cpipe)._queue._spare_chunk;
  __ptr = (paVar1->_ptr)._M_b._M_p;
  (paVar1->_ptr)._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  free(__ptr);
  return;
}

Assistant:

zmq::mailbox_t::~mailbox_t ()
{
    //  TODO: Retrieve and deallocate commands inside the _cpipe.

    // Work around problem that other threads might still be in our
    // send() method, by waiting on the mutex before disappearing.
    _sync.lock ();
    _sync.unlock ();
}